

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

Gia_Man_t *
Bmc_GiaGenerateGiaAllOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Bit_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  int Entry;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  Gia_ManCleanMark0(p);
  for (uVar17 = 0; iVar12 = p->nRegs, (int)uVar17 < iVar12; uVar17 = uVar17 + 1) {
    pGVar3 = Gia_ManCi(p,(p->vCis->nSize - iVar12) + uVar17);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      iVar12 = p->nRegs;
      break;
    }
    *(ulong *)pGVar3 =
         *(ulong *)pGVar3 & 0xffffffffbfffffff |
         (ulong)(((uint)(&pCex[1].iPo)[uVar17 >> 5] >> ((byte)uVar17 & 0x1f) & 1) << 0x1e);
  }
  pVVar4 = Vec_BitStart(iVar12);
  *pvInits = pVVar4;
  iVar1 = 0;
  iVar12 = 0;
  if (0 < iFrEnd) {
    iVar12 = iFrEnd;
  }
  for (; iVar1 != iVar12; iVar1 = iVar1 + 1) {
    if (iVar1 == iFrBeg) {
      iVar11 = 0;
      while ((iVar11 < p->nRegs &&
             (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar11), pGVar3 != (Gia_Obj_t *)0x0
             ))) {
        if ((pGVar3->field_0x3 & 0x40) != 0) {
          Vec_BitWriteEntry(*pvInits,iVar11,Entry);
        }
        iVar11 = iVar11 + 1;
      }
    }
    iVar11 = 0;
    while ((uVar2 = uVar17 + iVar11, iVar11 < p->vCis->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCi(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[(int)uVar2 >> 5] >> ((byte)uVar2 & 0x1f) & 1) << 0x1e);
      iVar11 = iVar11 + 1;
    }
    iVar11 = 0;
    while ((iVar11 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar10 = *(ulong *)pGVar3;
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar17 = (uint)(uVar10 >> 0x20);
        *(ulong *)pGVar3 =
             uVar10 & 0xffffffff3fffffff |
             (ulong)(((uVar17 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar17 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar10 >> 0x1d) & 7 ^
                      *(uint *)(pGVar3 + -(uVar10 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
      }
      iVar11 = iVar11 + 1;
    }
    iVar11 = 0;
    while ((iVar11 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar11), pGVar3 != (Gia_Obj_t *)0x0)))
    {
      uVar17 = (uint)*(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar17 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar17 & 0x1fffffff))) & 0x40000000);
      iVar11 = iVar11 + 1;
    }
    iVar11 = 0;
    while (((iVar11 < p->nRegs &&
            (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar11), pGVar3 != (Gia_Obj_t *)0x0)
            ) && (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar11),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000)
      ;
      iVar11 = iVar11 + 1;
    }
    uVar17 = uVar2;
  }
  if (iFrEnd < 0) {
    __assert_fail("i == iFrEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0x18a,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  p_00 = Gia_ManStart(10000);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  p->pObjs->Value = 1;
  iVar12 = 0;
  while ((iVar12 < p->vCis->nSize - p->nRegs &&
         (pGVar3 = Gia_ManCi(p,iVar12), pGVar3 != (Gia_Obj_t *)0x0))) {
    pGVar3->Value = 1;
    iVar12 = iVar12 + 1;
  }
  iVar12 = 0;
  while ((iVar12 < p->nRegs &&
         (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12), pGVar3 != (Gia_Obj_t *)0x0)))
  {
    iVar1 = Gia_ManAppendCi(p_00);
    uVar2 = Abc_LitNotCond(iVar1,(uint)((*(uint *)pGVar3 >> 0x1e & 1) == 0));
    pGVar3->Value = uVar2;
    iVar12 = iVar12 + 1;
  }
  Gia_ManHashStart(p_00);
  do {
    if (pCex->iFrame < iFrEnd) {
LAB_00485bbd:
      Gia_ManHashStop(p_00);
      if (uVar17 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0x1b8,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      pGVar3 = Gia_ManPo(p,pCex->iPo);
      Gia_ManAppendCo(p_00,pGVar3->Value);
      pGVar8 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar8;
    }
    iVar12 = 0;
    while ((uVar2 = uVar17 + iVar12, iVar12 < p->vCis->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCi(p,iVar12), pGVar3 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[(int)uVar2 >> 5] >> ((byte)uVar2 & 0x1f) & 1) << 0x1e);
      iVar12 = iVar12 + 1;
    }
    iVar1 = 0;
    while ((iVar1 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar1), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar10 = *(ulong *)pGVar3;
      uVar7 = uVar10 & 0x1fffffff;
      if (uVar7 != 0x1fffffff && -1 < (int)uVar10) {
        uVar13 = (uint)(uVar10 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -uVar7) >> 0x1e;
        uVar15 = (uint)(uVar10 >> 0x20);
        uVar9 = (ulong)(uVar15 & 0x1fffffff);
        uVar14 = *(uint *)(pGVar3 + -uVar9) >> 0x1e & 1;
        uVar15 = uVar15 >> 0x1d & 1;
        uVar16 = (uVar14 ^ uVar15) & uVar13;
        *(ulong *)pGVar3 = uVar10 & 0xffffffff3fffffff | (ulong)(uVar16 << 0x1e);
        if (uVar16 == 0) {
          if (((uVar13 & 1) == 0) && (uVar14 == uVar15)) {
            uVar15 = Gia_ManHashOr(p_00,pGVar3[-uVar7].Value,pGVar3[-uVar9].Value);
          }
          else if ((uVar13 & 1) == 0) {
            uVar15 = pGVar3[-uVar7].Value;
          }
          else {
            if (uVar14 != uVar15) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                            ,0x1a6,
                            "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                           );
            }
            uVar15 = pGVar3[-uVar9].Value;
          }
        }
        else {
          uVar15 = Gia_ManHashAnd(p_00,pGVar3[-uVar7].Value,pGVar3[-uVar9].Value);
        }
        pGVar3->Value = uVar15;
        if (uVar15 == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0x1a7,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
      }
      iVar1 = iVar1 + 1;
    }
    iVar1 = 0;
    while ((iVar1 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar1), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar15 = (uint)*(ulong *)pGVar3;
      uVar10 = (ulong)(uVar15 & 0x1fffffff);
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar15 * 2 ^ *(uint *)(pGVar3 + -uVar10)) & 0x40000000);
      uVar15 = pGVar3[-uVar10].Value;
      pGVar3->Value = uVar15;
      iVar1 = iVar1 + 1;
      if (uVar15 == 0) {
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0x1ad,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
    }
    if (iFrEnd == pCex->iFrame) {
      uVar17 = uVar17 + iVar12;
      goto LAB_00485bbd;
    }
    iVar12 = 0;
    while (((iVar12 < p->nRegs &&
            (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar12), pGVar3 != (Gia_Obj_t *)0x0)
            ) && (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000)
      ;
      pGVar5->Value = pGVar3->Value;
      iVar12 = iVar12 + 1;
    }
    iFrEnd = iFrEnd + 1;
    uVar17 = uVar2;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;
    Gia_ManForEachRo( p, pObjRo, k )
        pObjRo->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObjRo->fMark0 );
    Gia_ManHashStart( pNew );
    for ( i = iFrEnd; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value > 0 );
        } 
        if ( i == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->Value = pObjRi->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );

    // create PO
    Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}